

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c1a11d::LevelTest_TestLevelMonitoringLowBitrate_Test::TestBody
          (LevelTest_TestLevelMonitoringLowBitrate_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *in_RDI;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffee4;
  int *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef6;
  allocator *expr1;
  int iVar4;
  undefined4 in_stack_ffffffffffffff08;
  Type in_stack_ffffffffffffff0c;
  HasNewFatalFailureHelper *in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int local_bc;
  TestPartResultReporterInterface *in_stack_ffffffffffffff58;
  AssertHelper *in_stack_ffffffffffffff60;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  if (*(int *)(in_RDI + 0x3f8) != 4) {
    return;
  }
  expr1 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",expr1);
  uVar3 = 0x1e;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_ffffffffffffff10,
             (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (uint)((ulong)in_RDI >> 0x20),(uint)in_RDI,(int)((ulong)expr1 >> 0x20),(int)expr1,
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  in_RDI[0x3fc] = ' ';
  in_RDI[0x3fd] = '\0';
  in_RDI[0x3fe] = '\0';
  in_RDI[0x3ff] = '\0';
  in_RDI[0xb8] = -0x18;
  in_RDI[0xb9] = '\x03';
  in_RDI[0xba] = '\0';
  in_RDI[0xbb] = '\0';
  in_RDI[0x44] = '\x1e';
  in_RDI[0x45] = '\0';
  in_RDI[0x46] = '\0';
  in_RDI[0x47] = '\0';
  uVar1 = testing::internal::AlwaysTrue();
  local_bc = in_stack_fffffffffffffef0;
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_ffffffffffffff10)
    ;
    in_stack_fffffffffffffef6 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffef6) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,local_68);
    }
    bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)&stack0xffffffffffffff48);
    if (bVar2) {
      local_bc = 2;
    }
    else {
      local_bc = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffee4,uVar3));
    if (local_bc == 0) {
      testing::internal::CmpHelperLE<int,int>
                ((char *)expr1,
                 (char *)((ulong)CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffef6,
                                                         in_stack_fffffffffffffef4)) << 0x20),
                 in_stack_fffffffffffffee8,(int *)CONCAT44(in_stack_fffffffffffffee4,uVar3));
      iVar4 = (int)((ulong)expr1 >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff20);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff10);
        testing::AssertionResult::failure_message((AssertionResult *)0x8b0d47);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_RDI,iVar4,
                   (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffef6,
                                                   CONCAT24(in_stack_fffffffffffffef4,local_bc))));
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff60,(Message *)in_stack_ffffffffffffff58);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffee4,uVar3));
        testing::Message::~Message((Message *)0x8b0d95);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x8b0e07);
      goto LAB_008b0e19;
    }
    if (local_bc != 2) goto LAB_008b0e19;
  }
  iVar4 = (int)((ulong)expr1 >> 0x20);
  testing::Message::Message((Message *)in_stack_ffffffffffffff10);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_RDI,iVar4,
             (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffef6,
                                             CONCAT24(in_stack_fffffffffffffef4,local_bc))));
  testing::internal::AssertHelper::operator=
            (in_stack_ffffffffffffff60,(Message *)in_stack_ffffffffffffff58);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffee4,uVar3));
  testing::Message::~Message((Message *)0x8b0c99);
LAB_008b0e19:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x8b0e26);
  return;
}

Assistant:

TEST_P(LevelTest, TestLevelMonitoringLowBitrate) {
  // To save run time, we only test speed 4.
  if (cpu_used_ == 4) {
    libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 30);
    target_level_ = kLevelKeepStats;
    cfg_.rc_target_bitrate = 1000;
    cfg_.g_limit = 30;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_LE(level_[0], 0);
  }
}